

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void callhook(lua_State *L,CallInfo *ci)

{
  int local_1c;
  int hook;
  CallInfo *ci_local;
  lua_State *L_local;
  
  local_1c = 0;
  (ci->u).l.savedpc = (Instruction *)((ci->u).c.old_errfunc + 4);
  if ((((ci->previous->callstatus & 2) != 0) && (ci->previous->jitstatus == '\0')) &&
     ((*(uint *)((ci->previous->u).c.old_errfunc + -4) & 0xff) == 0x25)) {
    ci->callstatus = ci->callstatus | 0x20;
    local_1c = 4;
  }
  luaD_hook(L,local_1c,-1);
  (ci->u).l.savedpc = (Instruction *)((ci->u).c.old_errfunc + -4);
  return;
}

Assistant:

static void callhook (lua_State *L, CallInfo *ci) {
  int hook = LUA_HOOKCALL;
  ci->u.l.savedpc++;  /* hooks assume 'pc' is already incremented */
  if (isLua(ci->previous) && !isJITed(ci->previous) &&
      GET_OPCODE(*(ci->previous->u.l.savedpc - 1)) == OP_TAILCALL) {
    ci->callstatus |= CIST_TAIL;
    hook = LUA_HOOKTAILCALL;
  }
  luaD_hook(L, hook, -1);
  ci->u.l.savedpc--;  /* correct 'pc' */
}